

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statement.cpp
# Opt level: O0

span<const_slang::ast::StatementBlockSymbol_*const,_18446744073709551615UL>
slang::ast::Statement::createBlockItems
          (Scope *scope,StatementSyntax *syntax,bool labelHandled,
          SmallVector<const_slang::syntax::SyntaxNode_*,_5UL> *extraMembers)

{
  int iVar1;
  Compilation *this;
  undefined4 extraout_var;
  byte in_DL;
  EVP_PKEY_CTX *src;
  Scope *in_RDI;
  SmallVector<const_slang::ast::StatementBlockSymbol_*,_5UL> buffer;
  bool in_stack_00000157;
  SmallVector<const_slang::syntax::SyntaxNode_*,_5UL> *in_stack_00000158;
  SmallVectorBase<const_slang::ast::StatementBlockSymbol_*> *in_stack_00000160;
  StatementSyntax *in_stack_00000168;
  Scope *in_stack_00000170;
  SmallVectorBase<const_slang::ast::StatementBlockSymbol_*> local_70 [2];
  byte local_21;
  Scope *local_18;
  span<const_slang::ast::StatementBlockSymbol_*const,_18446744073709551615UL> local_10;
  
  local_21 = in_DL & 1;
  local_18 = in_RDI;
  SmallVector<const_slang::ast::StatementBlockSymbol_*,_5UL>::SmallVector
            ((SmallVector<const_slang::ast::StatementBlockSymbol_*,_5UL> *)0x4b62e9);
  findBlocks(in_stack_00000170,in_stack_00000168,in_stack_00000160,in_stack_00000158,
             in_stack_00000157);
  this = Scope::getCompilation(local_18);
  iVar1 = SmallVectorBase<const_slang::ast::StatementBlockSymbol_*>::copy
                    (local_70,(EVP_PKEY_CTX *)this,src);
  std::span<const_slang::ast::StatementBlockSymbol_*const,_18446744073709551615UL>::
  span<const_slang::ast::StatementBlockSymbol_*,_18446744073709551615UL>
            ((span<const_slang::ast::StatementBlockSymbol_*const,_18446744073709551615UL> *)this,
             (span<const_slang::ast::StatementBlockSymbol_*,_18446744073709551615UL> *)
             CONCAT44(extraout_var,iVar1));
  SmallVector<const_slang::ast::StatementBlockSymbol_*,_5UL>::~SmallVector
            ((SmallVector<const_slang::ast::StatementBlockSymbol_*,_5UL> *)0x4b6379);
  return local_10;
}

Assistant:

std::span<const StatementBlockSymbol* const> Statement::createBlockItems(
    const Scope& scope, const StatementSyntax& syntax, bool labelHandled,
    SmallVector<const SyntaxNode*>& extraMembers) {

    SmallVector<const StatementBlockSymbol*> buffer;
    findBlocks(scope, syntax, buffer, extraMembers, labelHandled);
    return buffer.copy(scope.getCompilation());
}